

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O2

string * __thiscall
t_java_generator::get_rpc_method_name
          (string *__return_storage_ptr__,t_java_generator *this,string *name)

{
  string local_30;
  
  if (this->fullcamel_style_ == true) {
    std::__cxx11::string::string((string *)&local_30,(string *)name);
    as_camel_case(__return_storage_ptr__,(t_java_generator *)name,&local_30,false);
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string t_java_generator::get_rpc_method_name(std::string name) {
  if (fullcamel_style_) {
    return as_camel_case(name, false);
  } else {
    return name;
  }
}